

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

ssize_t rw::Image::read(int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  char *__dest;
  long lVar2;
  char *pcVar3;
  long lVar4;
  undefined4 in_register_0000003c;
  long lVar5;
  
  sVar1 = strlen((char *)CONCAT44(in_register_0000003c,__fd));
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 999"
  ;
  __dest = (char *)(*DAT_00143848)(sVar1 + 0x14,0x10018);
  strcpy(__dest,(char *)CONCAT44(in_register_0000003c,__fd));
  sVar1 = strlen(__dest);
  __dest[sVar1] = '.';
  lVar5 = 0x18;
  lVar4 = 0;
  while( true ) {
    if (*(int *)(engine + 0x100 + (long)imageModuleOffset) <= lVar4) break;
    lVar2 = engine + imageModuleOffset;
    if (*(long *)(lVar2 + lVar5) != 0) {
      strncpy(__dest + sVar1 + 1,*(char **)(lVar2 + -8 + lVar5),0x13);
      pcVar3 = getFilename(__dest);
      if (pcVar3 != (char *)0x0) {
        lVar2 = (**(code **)(lVar5 + imageModuleOffset + engine))(pcVar3);
        (*DAT_00143840)(pcVar3);
        if (lVar2 != 0) goto LAB_0010b671;
      }
    }
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x18;
  }
  lVar2 = 0;
LAB_0010b671:
  (*DAT_00143840)(__dest);
  return lVar2;
}

Assistant:

Image*
Image::read(const char *imageName)
{
	int i;
	char *filename, *ext, *found;
	Image *img;

	filename = rwNewT(char, strlen(imageName) + 20, MEMDUR_FUNCTION | ID_IMAGE);
	strcpy(filename, imageName);
	ext = filename + strlen(filename);
	*ext++ = '.';
	// Try all supported extensions
	for(i = 0; i < IMAGEGLOBAL(numFileFormats); i++){
		if(IMAGEGLOBAL(fileFormats)[i].read == nil)
			continue;
		strncpy(ext, IMAGEGLOBAL(fileFormats)[i].extension, 19);
		found = getFilename(filename);
		// Found a file
		if(found){
			img = IMAGEGLOBAL(fileFormats)[i].read(found);
			rwFree(found);
			// It was a valid image of that format
			if(img){
				rwFree(filename);
				return img;
			}
		}
	}
	rwFree(filename);
	return nil;
}